

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void anon_unknown.dwarf_11b063f::SeedFast(CSHA512 *hasher)

{
  long lVar1;
  long in_FS_OFFSET;
  uchar *ptr;
  uint64_t local_40;
  uchar buffer [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = buffer;
  CSHA512::Write(hasher,(uchar *)&ptr,8);
  if ((anonymous_namespace)::g_rdrand_supported == '\x01') {
    local_40 = GetRdRand();
    CSHA512::Write(hasher,(uchar *)&local_40,8);
  }
  SeedTimestamp(hasher);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedFast(CSHA512& hasher) noexcept
{
    unsigned char buffer[32];

    // Stack pointer to indirectly commit to thread/callstack
    const unsigned char* ptr = buffer;
    hasher.Write((const unsigned char*)&ptr, sizeof(ptr));

    // Hardware randomness is very fast when available; use it always.
    SeedHardwareFast(hasher);

    // High-precision timestamp
    SeedTimestamp(hasher);
}